

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerMSL::analyze_workgroup_variables(CompilerMSL *this)

{
  uint uVar1;
  size_t sVar2;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  Variant *pVVar4;
  SPIRVariable *var;
  SPIRType *pSVar5;
  long lVar6;
  LoopLock loop_lock;
  LoopLock LStack_28;
  
  ParsedIR::create_loop_hard_lock(&(this->super_CompilerGLSL).super_Compiler.ir);
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 != 0) {
    pTVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar6 = 0;
    do {
      uVar1 = *(uint *)((long)&pTVar3->id + lVar6);
      pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[uVar1].type == TypeVariable) {
        var = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar1);
        if ((var->storage == StorageClassWorkgroup) && ((var->initializer).id != 0)) {
          this->needs_workgroup_zero_init = true;
          pSVar5 = Compiler::get_variable_data_type((Compiler *)this,var);
          if ((pSVar5->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
              buffer_size == 0 && (pSVar5->array).super_VectorView<unsigned_int>.buffer_size == 0) {
            this->suppress_sometimes_unitialized = true;
          }
        }
      }
      lVar6 = lVar6 + 4;
    } while (sVar2 << 2 != lVar6);
  }
  ParsedIR::LoopLock::~LoopLock(&LStack_28);
  return;
}

Assistant:

void CompilerMSL::analyze_workgroup_variables()
{
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		// If workgroup variables have initializer, it can only be ConstantNull (zero init)
		if (var.storage == StorageClassWorkgroup && var.initializer)
		{
			needs_workgroup_zero_init = true;

			// MSL compiler does not like the routine to initialize simple threadgroup variables,
			// falsely claiming it is "sometimes uninitialized". Suppress it.
			auto &type = get_variable_data_type(var);
			if (type.array.empty() && type.member_types.empty())
				suppress_sometimes_unitialized = true;
		}
	});
}